

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

int __thiscall ImGuiWS::init(ImGuiWS *this,EVP_PKEY_CTX *ctx)

{
  Parameters PVar1;
  undefined1 uVar2;
  pointer pIVar3;
  undefined8 extraout_RAX;
  string *in_RDX;
  Parameters parameters;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffae0;
  Parameters *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffffae8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  function<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffaf0;
  string *this_01;
  allocator<char> *paVar4;
  allocator<char> *paVar5;
  Parameters *pPVar6;
  allocator<char> *in_stack_fffffffffffffb10;
  Parameters *this_02;
  char *in_stack_fffffffffffffb18;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  undefined1 *puVar7;
  Parameters *this_04;
  string *psVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  string *psVar11;
  allocator<char> *paVar12;
  undefined1 *puVar13;
  string local_378 [56];
  string local_340 [32];
  string local_320 [39];
  undefined1 local_2f9 [40];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [32];
  ImGuiWS *local_288;
  undefined1 local_280 [80];
  function local_230 [32];
  ImGuiWS *local_210;
  undefined1 local_208 [40];
  function local_1e0 [32];
  pointer local_1c0;
  undefined1 local_1b8 [39];
  allocator<char> local_191;
  function local_190 [32];
  ImGuiWS *local_170;
  undefined1 local_168 [39];
  allocator<char> local_141;
  function local_140 [32];
  ImGuiWS *local_120;
  allocator<char> local_f1;
  function local_f0 [32];
  ImGuiWS *local_d0;
  allocator<char> local_a1;
  function local_a0 [95];
  allocator<char> local_41;
  function local_40 [52];
  undefined4 local_c;
  ImGuiWS *local_8;
  
  local_c = SUB84(ctx,0);
  local_8 = this;
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf21b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__0,void>
            ((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
              *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  Incppect<false>::var((string *)&pIVar3->incpp,local_40);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1cf2a5);
  std::__cxx11::string::~string((string *)local_40);
  std::allocator<char>::~allocator(&local_41);
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf2cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  local_d0 = this;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__1,void>
            ((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
              *)in_stack_fffffffffffffaf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
  Incppect<false>::var((string *)&pIVar3->incpp,local_a0);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1cf366);
  std::__cxx11::string::~string((string *)local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf38d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  local_120 = this;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__2,void>
            ((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
              *)in_stack_fffffffffffffaf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
  Incppect<false>::var((string *)&pIVar3->incpp,local_f0);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1cf427);
  std::__cxx11::string::~string((string *)local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf44e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  puVar13 = local_168;
  local_170 = this;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__3,void>
            ((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
              *)in_stack_fffffffffffffaf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
  Incppect<false>::var((string *)&pIVar3->incpp,local_140);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1cf4e8);
  std::__cxx11::string::~string((string *)local_140);
  std::allocator<char>::~allocator(&local_141);
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf50f);
  psVar11 = (string *)&pIVar3->incpp;
  paVar12 = &local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  puVar10 = local_1b8;
  local_1c0 = (pointer)this;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__4,void>
            ((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
              *)in_stack_fffffffffffffaf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
  Incppect<false>::var(psVar11,local_190);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1cf59d);
  std::__cxx11::string::~string((string *)local_190);
  std::allocator<char>::~allocator(&local_191);
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf5c4);
  psVar8 = (string *)&pIVar3->incpp;
  puVar9 = local_208 + 0x27;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  this_04 = (Parameters *)local_208;
  local_210 = this;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__5,void>
            ((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
              *)in_stack_fffffffffffffaf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
  Incppect<false>::var(psVar8,local_1e0);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1cf64c);
  std::__cxx11::string::~string((string *)local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)(local_208 + 0x27));
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf673);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pIVar3->incpp;
  puVar7 = local_280 + 0x4f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  __s = local_280 + 0x28;
  local_280._32_8_ = this;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__6,void>
            ((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
              *)in_stack_fffffffffffffaf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
  Incppect<false>::var((string *)this_03,local_230);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1cf6fb);
  std::__cxx11::string::~string((string *)local_230);
  std::allocator<char>::~allocator((allocator<char> *)(local_280 + 0x4f));
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf722);
  pPVar6 = (Parameters *)&pIVar3->incpp;
  this_02 = (Parameters *)local_280;
  local_288 = this;
  std::
  function<void(int,Incppect<false>::EventType,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<ImGuiWS::init(int,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__7,void>
            (in_stack_fffffffffffffaf0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffae8);
  Incppect<false>::handler((function *)pPVar6);
  std::
  function<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1cf779);
  paVar5 = &local_2a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,(allocator<char> *)this_02);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffae0,
              (value_type *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf7e4);
  this_01 = (string *)&pIVar3->incpp;
  paVar4 = &local_2d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,(allocator<char> *)this_02);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_2f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,(allocator<char> *)this_02);
  Incppect<false>::setResource(this_01,local_2d0);
  std::__cxx11::string::~string((string *)(local_2f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  Incppect<false>::Parameters::Parameters(this_04);
  std::__cxx11::string::operator=(local_378,in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,__x);
  std::__cxx11::string::operator=(local_340,"key.pem");
  std::__cxx11::string::operator=(local_320,"cert.pem");
  pIVar3 = std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
                     ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf92e);
  this_00 = (Parameters *)&pIVar3->incpp;
  Incppect<false>::Parameters::Parameters(this_02,pPVar6);
  PVar1.maxPayloadLength_bytes._3_1_ = in_stack_fffffffffffffadf;
  PVar1._0_7_ = in_stack_fffffffffffffad8;
  PVar1.tLastRequestTimeout_ms = (int64_t)this_00;
  PVar1._16_8_ = __x;
  PVar1.httpRoot._0_8_ = this_01;
  PVar1.httpRoot._M_string_length = (size_type)paVar4;
  PVar1.httpRoot.field_2._M_allocated_capacity = (size_type)paVar5;
  PVar1.httpRoot.field_2._8_8_ = pPVar6;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_02;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)__s;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = this_03;
  PVar1.sslKey._0_8_ = puVar7;
  PVar1.sslKey._M_string_length = (size_type)this_04;
  PVar1.sslKey.field_2._M_allocated_capacity = (size_type)psVar8;
  PVar1.sslKey.field_2._8_8_ = puVar9;
  PVar1.sslCert._0_8_ = puVar10;
  PVar1.sslCert._M_string_length = (size_type)psVar11;
  PVar1.sslCert.field_2._M_allocated_capacity = (size_type)paVar12;
  PVar1.sslCert.field_2._8_8_ = puVar13;
  Incppect<false>::runAsync(PVar1);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf979);
  std::thread::operator=
            ((thread *)this_00,
             (thread *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  std::thread::~thread((thread *)0x1cf99a);
  Incppect<false>::Parameters::~Parameters(this_00);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1cf9b4);
  uVar2 = std::thread::joinable((thread *)this_00);
  Incppect<false>::Parameters::~Parameters(this_00);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),uVar2) & 0xffffff01;
}

Assistant:

bool ImGuiWS::init(int32_t port, std::string pathHttp, std::vector<std::string> resources) {
    m_impl->incpp.var("my_id[%d]", [](const auto & idxs) {
        static int32_t id;
        id = idxs[0];
        return incppect::view(id);
    });

    // number of textures available
    m_impl->incpp.var("imgui.n_textures", [this](const auto & ) {
        std::shared_lock lock(m_impl->mutex);

        return incppect::view(m_impl->dataRead.textures.size());
    });

    // texture ids
    m_impl->incpp.var("imgui.texture_id[%d]", [this](const auto & idxs) {
        std::shared_lock lock(m_impl->mutex);

        if (m_impl->dataRead.textureIdMap.find(idxs[0]) == m_impl->dataRead.textureIdMap.end()) {
            return std::string_view { };
        }

        return incppect::view(m_impl->dataRead.textureIdMap[idxs[0]]);
    });

    // texture revision
    m_impl->incpp.var("imgui.texture_revision[%d]", [this](const auto & idxs) {
        std::shared_lock lock(m_impl->mutex);

        if (m_impl->dataRead.textures.find(idxs[0]) == m_impl->dataRead.textures.end()) {
            return std::string_view { };
        }

        return incppect::view(m_impl->dataRead.textures[idxs[0]].revision);
    });

    // get texture by id
    m_impl->incpp.var("imgui.texture_data[%d]", [this](const auto & idxs) {
        static std::vector<char> data;
        {
            std::shared_lock lock(m_impl->mutex);
            if (m_impl->dataRead.textures.find(idxs[0]) == m_impl->dataRead.textures.end()) {
                return std::string_view { 0, 0 };
            }
            data.clear();
            std::copy(m_impl->dataRead.textures[idxs[0]].data.data(), m_impl->dataRead.textures[idxs[0]].data.data() + m_impl->dataRead.textures[idxs[0]].data.size(),
                      std::back_inserter(data));
        }

        return std::string_view { data.data(), data.size() };
    });

    // get imgui's draw data
    m_impl->incpp.var("imgui.n_draw_lists", [this](const auto & ) {
        std::shared_lock lock(m_impl->mutex);

        return incppect::view(m_impl->dataRead.drawLists.size());
    });

    m_impl->incpp.var("imgui.draw_list[%d]", [this](const auto & idxs) {
        static std::vector<char> data;
        {
            std::shared_lock lock(m_impl->mutex);

            if (idxs[0] >= (int) m_impl->dataRead.drawLists.size()) {
                return std::string_view { nullptr, 0 };
            }

            data.clear();
            std::copy(m_impl->dataRead.drawLists[idxs[0]].data(),
                      m_impl->dataRead.drawLists[idxs[0]].data() + m_impl->dataRead.drawLists[idxs[0]].size(),
                      std::back_inserter(data));
        }

        return std::string_view { data.data(), data.size() };
    });

    m_impl->incpp.handler([&](int clientId, incppect::EventType etype, std::string_view data) {
        Event event;

        event.clientId = clientId;

        switch (etype) {
            case incppect::Connect:
                {
                    ++m_impl->nConnected;
                    event.type = Event::Connected;
                    std::stringstream ss;
                    { int a = data[0]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[1]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[2]; if (a < 0) a += 256; ss << a << "."; }
                    { int a = data[3]; if (a < 0) a += 256; ss << a; }
                    event.ip = ss.str();
                    if (m_impl->handlerConnect) {
                        m_impl->handlerConnect();
                    }
                }
                break;
            case incppect::Disconnect:
                {
                    --m_impl->nConnected;
                    event.type = Event::Disconnected;
                    if (m_impl->handlerDisconnect) {
                        m_impl->handlerDisconnect();
                    }
                }
                break;
            case incppect::Custom:
                {
                    std::stringstream ss;
                    ss << data;

                    int type = -1;
                    ss >> type;

                    //printf("Received event %d '%s'\n", type, ss.str().c_str());
                    switch (type) {
                        case 0:
                            {
                                // mouse move
                                event.type = Event::MouseMove;
                                ss >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %g %g\n", event.mouse_x, event.mouse_y);
                            }
                            break;
                        case 1:
                            {
                                // mouse down
                                event.type = Event::MouseDown;
                                ss >> event.mouse_but >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %d down\n", event.mouse_but);
                            }
                            break;
                        case 2:
                            {
                                // mouse up
                                event.type = Event::MouseUp;
                                ss >> event.mouse_but >> event.mouse_x >> event.mouse_y;
                                //printf("    mouse %d up\n", event.mouse_but);
                            }
                            break;
                        case 3:
                            {
                                // mouse wheel
                                event.type = Event::MouseWheel;
                                ss >> event.wheel_x >> event.wheel_y;
                            }
                            break;
                        case 4:
                            {
                                // key press
                                event.type = Event::KeyPress;
                                ss >> event.key;
                            }
                            break;
                        case 5:
                            {
                                // key down
                                event.type = Event::KeyDown;
                                ss >> event.key;
                            }
                            break;
                        case 6:
                            {
                                // key up
                                event.type = Event::KeyUp;
                                ss >> event.key;
                            }
                            break;
                        case 7:
                            {
                                // resize
                                event.type = Event::Resize;
                                ss >> event.client_width >> event.client_height;
                            }
                            break;
                        case 8:
                            {
                                // take control
                                event.type = Event::TakeControl;
                            }
                            break;
                        default:
                            {
                                printf("Unknown input received from client: id = %d, type = %d\n", clientId, type);
                                return;
                            }
                            break;
                    };
                }
                break;
        };

        m_impl->events.push(std::move(event));
    });

    resources.push_back("imgui-ws.js");
    m_impl->incpp.setResource("/imgui-ws.js", kImGuiWS_js);

    // start the http/websocket server
    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 1024*1024;
    parameters.tLastRequestTimeout_ms = -1;
    parameters.httpRoot = std::move(pathHttp);
    parameters.resources = std::move(resources);
    parameters.sslKey = "key.pem";
    parameters.sslCert = "cert.pem";
    m_impl->worker = m_impl->incpp.runAsync(parameters);

    return m_impl->worker.joinable();
}